

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O0

double __thiscall hmm::calculateProbability(hmm *this)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  long in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double prob;
  int t;
  hmm *in_stack_00000128;
  key_type *in_stack_fffffffffffffef8;
  unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
  *in_stack_ffffffffffffff00;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_00;
  hmm *in_stack_ffffffffffffff08;
  undefined4 local_3c;
  undefined8 local_8;
  
  bVar2 = createMaps(in_stack_00000128);
  if (bVar2) {
    std::
    unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
    ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar4 = B1(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
               (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
    std::
    unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
    ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar5 = B2(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
               (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    *pmVar3 = dVar4 * 0.5 * dVar5;
    std::
    unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
    ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar4 = B1(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
               (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
    std::
    unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
    ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar5 = B2(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
               (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    *pmVar3 = dVar4 * 0.5 * dVar5;
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    mVar1 = *pmVar3;
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    *pmVar3 = mVar1;
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    mVar1 = *pmVar3;
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    *pmVar3 = mVar1;
    for (local_3c = 1; local_3c < *(int *)(in_RDI + 0x1c0); local_3c = local_3c + 1) {
      std::
      unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
      ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff08 =
           (hmm *)B1(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                     (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00
                    );
      std::
      unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
      ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar6 = B2(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      dVar6 = (double)in_stack_ffffffffffffff08 * dVar6;
      dVar7 = A(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar4 = *pmVar3;
      dVar8 = A(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar5 = *pmVar3;
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      *pmVar3 = dVar6 * (dVar7 * dVar4 + dVar8 * dVar5);
      std::
      unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
      ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar6 = B1(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      std::
      unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
      ::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar7 = B2(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      dVar8 = A(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar4 = *pmVar3;
      dVar9 = A(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                (char)((ulong)in_stack_ffffffffffffff00 >> 0x30),(int)in_stack_ffffffffffffff00);
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      dVar5 = *pmVar3;
      pmVar3 = std::
               unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      *pmVar3 = dVar6 * dVar7 * (dVar8 * dVar4 + dVar9 * dVar5);
    }
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    this_00 = (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)*pmVar3;
    pmVar3 = std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[](this_00,in_stack_fffffffffffffef8);
    local_8 = (double)this_00 + *pmVar3;
  }
  else {
    local_8 = -1000.0;
  }
  return local_8;
}

Assistant:

double hmm::calculateProbability(){
    if(!this->createMaps()){
        return -1000;
    }
    this->CProb[1] = 0.5 * B1('C',this->observedChroma1[1],1) * B2('C',this->observedChroma2[1],1);
    this->OProb[1] = 0.5 * B1('O',this->observedChroma1[1],1) * B2('O',this->observedChroma2[1],1);
//    cout<<"Initial: "<<endl;
//    cout<<"Cprob[1]: "<<this->CProb[1]<<endl;
//    cout<<"Oprob[1]: "<<this->CProb[1]<<endl;
//    cout<<"----------------------------"<<endl;
//    double scaleFactor = 1/((double)(this->CProb[1]+this->OProb[1]));
    this->CProb[1] = this->CProb[1];
    this->OProb[1] = this->OProb[1];
//    double scaleFactorLog = log10(scaleFactor);

    for(int t = 1; t<T; t++){
        this->CProb[t+1] = B1('C',this->observedChroma1[t+1],t+1) * B2('C',this->observedChroma2[t+1],t+1) * ( A('C','C',t+1)*this->CProb[t] + A('O','C',t+1)*this->OProb[t] );
        this->OProb[t+1] = B1('O',this->observedChroma1[t+1],t+1) * B2('O',this->observedChroma2[t+1],t+1) * ( A('C','O',t+1)*this->CProb[t] + A('O','O',t+1)*this->OProb[t] );
//        cout<<"Iteration: "<<t+1<<endl;
//        cout<<"Cprob["<<t+1<<"]: "<<this->CProb[t+1]<<endl;
//        cout<<"Oprob["<<t+1<<"]: "<<this->OProb[t+1]<<endl;
//        cout<<"----------------------------"<<endl;
//        scaleFactor = 1/((double)(this->CProb[t+1]+this->OProb[t+1]));
//        this->CProb[t+1] = this->CProb[t+1]*(double)scaleFactor;
//        this->OProb[t+1] =this->OProb[t+1]*(double)scaleFactor;

//        scaleFactorLog += log10(scaleFactor);
    }

    double prob = this->CProb[T]+this->OProb[T];
    return prob/*pow10(-1*scaleFactorLog)*/;

}